

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

RaviArray * raviH_new_number_array(lua_State *L,uint len,lua_Number init_value)

{
  char *pcVar1;
  int iVar2;
  RaviArray *t;
  ulong uVar3;
  uint new_size;
  
  t = raviH_new(L,0x40,0);
  new_size = len + 1;
  if (new_size != 0) {
    iVar2 = ravi_resize_array(L,t,new_size,0);
    if (iVar2 != 0) {
      pcVar1 = t->data;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      if (1 < new_size) {
        uVar3 = 1;
        do {
          *(lua_Number *)(pcVar1 + uVar3 * 8) = init_value;
          uVar3 = uVar3 + 1;
        } while (new_size != uVar3);
      }
      t->len = new_size;
      t->flags = t->flags | 2;
      return t;
    }
  }
  luaG_runerror(L,"array length out of range");
}

Assistant:

RaviArray *raviH_new_number_array(lua_State *L, unsigned int len,
                              lua_Number init_value) {
  RaviArray *t = raviH_new(L, RAVI_TM_FLOAT_ARRAY, 0);
  unsigned int new_len = len + 1; // Ravi arrays have an extra slot at offset 0
  if (new_len < len) { // Wrapped?
    luaG_runerror(L, "array length out of range");
  }
  if (!ravi_resize_array(L, t, new_len, 0)) {
    luaG_runerror(L, "array length out of range");
  }
  lua_Number *data = (lua_Number *)t->data;
  data[0] = 0;
  for (unsigned int i = 1; i < new_len; i++) {
    data[i] = init_value;
  }
  t->len = new_len;
  t->flags |= RAVI_ARRAY_FIXEDSIZE;
  return t;
}